

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.h
# Opt level: O0

StoreInstr * __thiscall
flow::IRBuilder::
insert<flow::StoreInstr,flow::Value*&,flow::ConstantValue<long,(flow::LiteralType)2>*&,flow::Value*&,std::__cxx11::string>
          (IRBuilder *this,Value **args,ConstantValue<long,_(flow::LiteralType)2> **args_1,
          Value **args_2,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3)

{
  Instr *pIVar1;
  unique_ptr<flow::StoreInstr,_std::default_delete<flow::StoreInstr>_> local_40;
  unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_3;
  Value **args_local_2;
  ConstantValue<long,_(flow::LiteralType)2> **args_local_1;
  Value **args_local;
  IRBuilder *this_local;
  
  local_30 = args_3;
  args_local_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_2;
  args_local_2 = (Value **)args_1;
  args_local_1 = (ConstantValue<long,_(flow::LiteralType)2> **)args;
  args_local = (Value **)this;
  std::
  make_unique<flow::StoreInstr,flow::Value*,flow::ConstantValue<long,(flow::LiteralType)2>*,flow::Value*,std::__cxx11::string>
            ((Value **)&local_40,(ConstantValue<long,_(flow::LiteralType)2> **)args,(Value **)args_1
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_2);
  std::unique_ptr<flow::Instr,std::default_delete<flow::Instr>>::
  unique_ptr<flow::StoreInstr,std::default_delete<flow::StoreInstr>,void>
            ((unique_ptr<flow::Instr,std::default_delete<flow::Instr>> *)&local_38,&local_40);
  pIVar1 = insert(this,&local_38);
  std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>::~unique_ptr(&local_38);
  std::unique_ptr<flow::StoreInstr,_std::default_delete<flow::StoreInstr>_>::~unique_ptr(&local_40);
  return (StoreInstr *)pIVar1;
}

Assistant:

T* insert(Args&&... args) {
    return static_cast<T*>(insert(std::make_unique<T>(std::move(args)...)));
  }